

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O1

int scv_shrink_to_fit(scv_vector *v)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x108,"int scv_shrink_to_fit(struct scv_vector *)");
  }
  if (v->data == (void *)0x0) {
    __assert_fail("v->data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x109,
                  "int scv_shrink_to_fit(struct scv_vector *)");
  }
  uVar4 = v->size;
  iVar3 = 0;
  if (v->capacity != uVar4) {
    uVar1 = v->objsize;
    if (uVar1 == 0) {
      __assert_fail("v->objsize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x111,
                    "int scv_shrink_to_fit(struct scv_vector *)");
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) <= uVar4) {
      __assert_fail("newcapacity < (size_t) -1 / v->objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x112,
                    "int scv_shrink_to_fit(struct scv_vector *)");
    }
    if (uVar1 * uVar4 < 0x40) {
      uVar4 = (uVar1 + 0x3f) / uVar1;
    }
    pvVar5 = realloc(v->data,uVar1 * uVar4);
    if (pvVar5 == (void *)0x0) {
      iVar3 = -2;
    }
    else {
      v->data = pvVar5;
      v->capacity = uVar4;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int scv_shrink_to_fit(struct scv_vector *v)
{
	void *newdata;
	size_t newcapacity;

	assert(v != NULL);
	assert(v->data != NULL);

	if (v->capacity == v->size) {
		return SCV_OK;
	}

	newcapacity = v->size;

	assert(v->objsize > 0);
	assert(newcapacity < (size_t) -1 / v->objsize);

	/* Minimum capacity is SCV_MIN_ALLOC bytes or 1 element */
	if (newcapacity * v->objsize < SCV_MIN_ALLOC) {
		newcapacity = (SCV_MIN_ALLOC + (v->objsize - 1)) / v->objsize;
	}

	newdata = realloc(v->data, newcapacity * v->objsize);

	if (newdata == NULL) {
		return SCV_ENOMEM;
	}

	v->data = newdata;
	v->capacity = newcapacity;

	return SCV_OK;
}